

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCtxtResetPush(void)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr val;
  char *val_00;
  char *val_01;
  char *val_02;
  int local_5c;
  int n_encoding;
  char *encoding;
  int n_filename;
  char *filename;
  int local_38;
  int n_size;
  int size;
  int n_chunk;
  char *chunk;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (chunk._4_4_ = 0; (int)chunk._4_4_ < 3; chunk._4_4_ = chunk._4_4_ + 1) {
    for (n_size = 0; n_size < 4; n_size = n_size + 1) {
      for (filename._4_4_ = 0; (int)filename._4_4_ < 4; filename._4_4_ = filename._4_4_ + 1) {
        for (encoding._4_4_ = 0; (int)encoding._4_4_ < 8; encoding._4_4_ = encoding._4_4_ + 1) {
          for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
            iVar1 = xmlMemBlocks();
            val = gen_xmlParserCtxtPtr(chunk._4_4_,0);
            val_00 = gen_const_char_ptr(n_size,1);
            local_38 = gen_int(filename._4_4_,2);
            val_01 = gen_filepath(encoding._4_4_,3);
            val_02 = gen_const_char_ptr(local_5c,4);
            if (val_00 != (char *)0x0) {
              iVar2 = xmlStrlen(val_00);
              if (iVar2 < local_38) {
                local_38 = 0;
              }
            }
            iVar2 = xmlCtxtResetPush(val,val_00,local_38,val_01,val_02);
            desret_int(iVar2);
            call_tests = call_tests + 1;
            des_xmlParserCtxtPtr(chunk._4_4_,val,0);
            des_const_char_ptr(n_size,val_00,1);
            des_int(filename._4_4_,local_38,2);
            des_filepath(encoding._4_4_,val_01,3);
            des_const_char_ptr(local_5c,val_02,4);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlCtxtResetPush",(ulong)(uint)(iVar2 - iVar1));
              ret_val = ret_val + 1;
              printf(" %d",(ulong)chunk._4_4_);
              printf(" %d",(ulong)(uint)n_size);
              printf(" %d",(ulong)filename._4_4_);
              printf(" %d",(ulong)encoding._4_4_);
              printf(" %d");
              printf("\n");
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlCtxtResetPush(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlParserCtxtPtr ctxt; /* an XML parser context */
    int n_ctxt;
    const char * chunk; /* a pointer to an array of chars */
    int n_chunk;
    int size; /* number of chars in the array */
    int n_size;
    const char * filename; /* an optional file name or URI */
    int n_filename;
    const char * encoding; /* the document encoding, or NULL */
    int n_encoding;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_chunk = 0;n_chunk < gen_nb_const_char_ptr;n_chunk++) {
    for (n_size = 0;n_size < gen_nb_int;n_size++) {
    for (n_filename = 0;n_filename < gen_nb_filepath;n_filename++) {
    for (n_encoding = 0;n_encoding < gen_nb_const_char_ptr;n_encoding++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        chunk = gen_const_char_ptr(n_chunk, 1);
        size = gen_int(n_size, 2);
        filename = gen_filepath(n_filename, 3);
        encoding = gen_const_char_ptr(n_encoding, 4);
        if ((chunk != NULL) &&
            (size > xmlStrlen(BAD_CAST chunk)))
            size = 0;

        ret_val = xmlCtxtResetPush(ctxt, chunk, size, filename, encoding);
        desret_int(ret_val);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_const_char_ptr(n_chunk, chunk, 1);
        des_int(n_size, size, 2);
        des_filepath(n_filename, filename, 3);
        des_const_char_ptr(n_encoding, encoding, 4);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCtxtResetPush",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_chunk);
            printf(" %d", n_size);
            printf(" %d", n_filename);
            printf(" %d", n_encoding);
            printf("\n");
        }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}